

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

char * get_frame_type_as_string(AMQP_VALUE descriptor)

{
  _Bool _Var1;
  char *pcVar2;
  
  _Var1 = is_sasl_mechanisms_type_by_descriptor(descriptor);
  if (_Var1) {
    pcVar2 = "[SASL MECHANISMS]";
  }
  else {
    _Var1 = is_sasl_init_type_by_descriptor(descriptor);
    if (_Var1) {
      pcVar2 = "[SASL INIT]";
    }
    else {
      _Var1 = is_sasl_challenge_type_by_descriptor(descriptor);
      if (_Var1) {
        pcVar2 = "[SASL CHALLENGE]";
      }
      else {
        _Var1 = is_sasl_response_type_by_descriptor(descriptor);
        if (_Var1) {
          pcVar2 = "[SASL RESPONSE]";
        }
        else {
          _Var1 = is_sasl_outcome_type_by_descriptor(descriptor);
          pcVar2 = "[Unknown]";
          if (_Var1) {
            pcVar2 = "[SASL OUTCOME]";
          }
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

static const char* get_frame_type_as_string(AMQP_VALUE descriptor)
{
    const char* result;

    if (is_open_type_by_descriptor(descriptor))
    {
        result = "[OPEN]";
    }
    else if (is_begin_type_by_descriptor(descriptor))
    {
        result = "[BEGIN]";
    }
    else if (is_attach_type_by_descriptor(descriptor))
    {
        result = "[ATTACH]";
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        result = "[FLOW]";
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        result = "[DISPOSITION]";
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        result = "[TRANSFER]";
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        result = "[DETACH]";
    }
    else if (is_end_type_by_descriptor(descriptor))
    {
        result = "[END]";
    }
    else if (is_close_type_by_descriptor(descriptor))
    {
        result = "[CLOSE]";
    }
    else
    {
        result = "[Unknown]";
    }

    return result;
}